

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall
QPDF::readStream(QPDF *this,QPDFObjectHandle *object,QPDFObjGen og,qpdf_offset_t offset)

{
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  QPDFExc *pQVar5;
  qpdf_offset_t qVar6;
  QPDFObjectHandle local_1f0;
  QPDFObjGen local_1e0;
  Stream local_1d8;
  BaseHandle local_1c8 [3];
  QPDFExc *e;
  string local_190;
  allocator<char> local_169;
  string local_168;
  Token local_148;
  unsigned_long_long local_e0;
  undefined1 local_d2;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  QPDFObjectHandle length_obj;
  size_t length;
  qpdf_offset_t stream_offset;
  qpdf_offset_t offset_local;
  QPDFObjectHandle *object_local;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  validateStreamLineEnd(this,object,og,offset);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar3->file);
  iVar2 = (*peVar4->_vptr_InputSource[4])();
  length_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"/Length",&local_71);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_50,(string *)object);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_50);
  if (bVar1) {
    local_e0 = QPDFObjectHandle::getUIntValue((QPDFObjectHandle *)local_50);
    length_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)toS<unsigned_long_long>(&local_e0);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar3->file);
    (*peVar4->_vptr_InputSource[5])(peVar4,CONCAT44(extraout_var,iVar2),0);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar3->file);
    qVar6 = toO<unsigned_long>((unsigned_long *)
                               &length_obj.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
    (*peVar4->_vptr_InputSource[5])(peVar4,qVar6,1);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar3->file);
    readToken(&local_148,this,peVar4,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"endstream",&local_169);
    bVar1 = QPDFTokenizer::Token::isWord(&local_148,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    QPDFTokenizer::Token::~Token(&local_148);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_50);
      local_1e0 = og;
      QPDFObjectHandle::QPDFObjectHandle(&local_1f0,object);
      ::qpdf::Stream::Stream
                (&local_1d8,this,local_1e0,&local_1f0,CONCAT44(extraout_var,iVar2),
                 (size_t)length_obj.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
      ::qpdf::BaseHandle::operator_cast_to_QPDFObjectHandle(local_1c8);
      QPDFObjectHandle::operator=(object,(QPDFObjectHandle *)local_1c8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1c8);
      ::qpdf::Stream::~Stream(&local_1d8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1f0);
      return;
    }
    QTC::TC("qpdf","QPDF missing endstream",0);
    e._6_1_ = 1;
    pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"expected endstream",(allocator<char> *)((long)&e + 7));
    damagedPDF(pQVar5,this,&local_190);
    e._6_1_ = 0;
    __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_50);
  if (!bVar1) {
    QTC::TC("qpdf","QPDF stream length not integer",0);
    local_d2 = 1;
    pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"/Length key in stream dictionary is not an integer",&local_d1);
    damagedPDF(pQVar5,this,offset,&local_d0);
    local_d2 = 0;
    __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  QTC::TC("qpdf","QPDF stream without length",0);
  local_aa = 1;
  pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"stream dictionary lacks /Length key",&local_a9);
  damagedPDF(pQVar5,this,offset,&local_a8);
  local_aa = 0;
  __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::readStream(QPDFObjectHandle& object, QPDFObjGen og, qpdf_offset_t offset)
{
    validateStreamLineEnd(object, og, offset);

    // Must get offset before accessing any additional objects since resolving a previously
    // unresolved indirect object will change file position.
    qpdf_offset_t stream_offset = m->file->tell();
    size_t length = 0;

    try {
        auto length_obj = object.getKey("/Length");

        if (!length_obj.isInteger()) {
            if (length_obj.isNull()) {
                QTC::TC("qpdf", "QPDF stream without length");
                throw damagedPDF(offset, "stream dictionary lacks /Length key");
            }
            QTC::TC("qpdf", "QPDF stream length not integer");
            throw damagedPDF(offset, "/Length key in stream dictionary is not an integer");
        }

        length = toS(length_obj.getUIntValue());
        // Seek in two steps to avoid potential integer overflow
        m->file->seek(stream_offset, SEEK_SET);
        m->file->seek(toO(length), SEEK_CUR);
        if (!readToken(*m->file).isWord("endstream")) {
            QTC::TC("qpdf", "QPDF missing endstream");
            throw damagedPDF("expected endstream");
        }
    } catch (QPDFExc& e) {
        if (m->attempt_recovery) {
            warn(e);
            length = recoverStreamLength(m->file, og, stream_offset);
        } else {
            throw;
        }
    }
    object = QPDFObjectHandle(qpdf::Stream(*this, og, object, stream_offset, length));
}